

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

bool libtorrent::aux::anon_unknown_135::trigger_announce
               (session_interface *ses,bool is_ssl,bool complete_sent,reannounce_flags_t flags,
               time_point t,announce_entry *e)

{
  byte *pbVar1;
  pointer paVar2;
  int iVar3;
  bool bVar4;
  long lVar5;
  pointer paVar6;
  int iVar7;
  
  refresh_endpoint_list(ses,is_ssl,complete_sent,e);
  paVar2 = (e->endpoints).
           super__Vector_base<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar4 = false;
  for (paVar6 = (e->endpoints).
                super__Vector_base<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>
                ._M_impl.super__Vector_impl_data._M_start; lVar5 = 100, paVar6 != paVar2;
      paVar6 = paVar6 + 1) {
    for (; lVar5 != 0xf4; lVar5 = lVar5 + 0x48) {
      iVar3 = (int)((long)t.__d.__r / 1000000000);
      iVar7 = iVar3;
      if (((flags.m_val & 1) == 0) &&
         (iVar7 = *(int *)((long)(paVar6->info_hashes).
                                 super_array<libtorrent::aux::announce_infohash,_2UL>._M_elems +
                          lVar5 + -0x30), iVar7 <= iVar3)) {
        iVar7 = iVar3;
      }
      *(int *)((long)(paVar6->info_hashes).super_array<libtorrent::aux::announce_infohash,_2UL>.
                     _M_elems + lVar5 + -0x34) = iVar7 + 1;
      *(int *)((long)(paVar6->info_hashes).super_array<libtorrent::aux::announce_infohash,_2UL>.
                     _M_elems + lVar5 + -0x30) = iVar7 + 1;
      pbVar1 = (byte *)((long)(paVar6->info_hashes).
                              super_array<libtorrent::aux::announce_infohash,_2UL>._M_elems +
                       lVar5 + -0x1f);
      *pbVar1 = *pbVar1 | 4;
    }
    bVar4 = true;
  }
  return bVar4;
}

Assistant:

bool trigger_announce(aux::session_interface& ses
		, bool const is_ssl
		, bool const complete_sent
		, reannounce_flags_t const flags
		, time_point const t
		, aux::announce_entry& e)
	{
		bool ret = false;
		// make sure we check for new endpoints from the listen sockets
		refresh_endpoint_list(ses, is_ssl, complete_sent, e);
		for (auto& aep : e.endpoints)
		{
			for (auto& a : aep.info_hashes)
			{
				a.next_announce = (flags & torrent_handle::ignore_min_interval)
					? time_point_cast<seconds32>(t) + seconds32(1)
					: std::max(time_point_cast<seconds32>(t), a.min_announce) + seconds32(1);
				a.min_announce = a.next_announce;
				a.triggered_manually = true;
				ret = true;
			}
		}
		return ret;
	}